

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::repeat_timeout(double time,Fl_Timeout_Handler cb,void *argp)

{
  bool bVar1;
  Timeout **local_30;
  Timeout **p;
  Timeout *t;
  void *argp_local;
  Fl_Timeout_Handler cb_local;
  double time_local;
  
  cb_local = (Fl_Timeout_Handler)(missed_timeout_by + time);
  if ((double)cb_local < -0.05) {
    cb_local = (Fl_Timeout_Handler)0x0;
  }
  p = (Timeout **)free_timeout;
  if (free_timeout == (Timeout *)0x0) {
    p = (Timeout **)operator_new(0x20);
  }
  else {
    free_timeout = free_timeout->next;
  }
  *p = (Timeout *)cb_local;
  p[1] = (Timeout *)cb;
  p[2] = (Timeout *)argp;
  local_30 = &first_timeout;
  while( true ) {
    bVar1 = false;
    if (*local_30 != (Timeout *)0x0) {
      bVar1 = (*local_30)->time <= (double)cb_local;
    }
    if (!bVar1) break;
    local_30 = &(*local_30)->next;
  }
  p[3] = *local_30;
  *local_30 = (Timeout *)p;
  return;
}

Assistant:

void Fl::repeat_timeout(double time, Fl_Timeout_Handler cb, void *argp) {
  time += missed_timeout_by; if (time < -.05) time = 0;
  Timeout* t = free_timeout;
  if (t) {
      free_timeout = t->next;
  } else {
      t = new Timeout;
  }
  t->time = time;
  t->cb = cb;
  t->arg = argp;
  // insert-sort the new timeout:
  Timeout** p = &first_timeout;
  while (*p && (*p)->time <= time) p = &((*p)->next);
  t->next = *p;
  *p = t;
}